

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O2

void mul128By64To192(uint64_t a0,uint64_t a1,uint64_t b,uint64_t *z0Ptr,uint64_t *z1Ptr,
                    uint64_t *z2Ptr)

{
  uint64_t z2;
  uint64_t more1;
  uint64_t local_50;
  ulong local_48;
  ulong local_40;
  uint64_t local_38;
  
  mul64To128(a1,b,&local_48,&local_50);
  mul64To128(a0,b,&local_38,&local_40);
  *z2Ptr = local_50;
  *z1Ptr = local_48 + local_40;
  *z0Ptr = local_38 + CARRY8(local_48,local_40);
  return;
}

Assistant:

static inline void
 mul128By64To192(
     uint64_t a0,
     uint64_t a1,
     uint64_t b,
     uint64_t *z0Ptr,
     uint64_t *z1Ptr,
     uint64_t *z2Ptr
 )
{
    uint64_t z0, z1, z2, more1;

    mul64To128( a1, b, &z1, &z2 );
    mul64To128( a0, b, &z0, &more1 );
    add128( z0, more1, 0, z1, &z0, &z1 );
    *z2Ptr = z2;
    *z1Ptr = z1;
    *z0Ptr = z0;

}